

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O3

char get_escaped_char(char c,int chr)

{
  char cVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,c);
  if (iVar2 < 0x66) {
    if (iVar2 == 0x5c) {
      return '\\';
    }
    if (iVar2 == 0x61) {
      return '\a';
    }
    if (iVar2 == 0x62) {
      return '\b';
    }
  }
  else {
    switch(iVar2) {
    case 0x6e:
      return '\n';
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
    case 0x75:
      break;
    case 0x72:
      return '\r';
    case 0x74:
      return '\t';
    case 0x76:
      return '\v';
    default:
      if (iVar2 == 0x66) {
        return '\f';
      }
    }
  }
  if (c == '\'' && chr != 0) {
    return '\'';
  }
  cVar1 = '\"';
  if (chr != 0) {
    cVar1 = '\0';
  }
  if (c != '\"') {
    cVar1 = '\0';
  }
  return cVar1;
}

Assistant:

static char get_escaped_char(char c, int chr)
{
    switch(c)
    {
        case 'a': return '\a';
        case 'b': return '\b';
        case 't': return '\t';
        case 'n': return '\n';
        case 'v': return '\v';
        case 'f': return '\f';
        case 'r': return '\r';
        case '\\': return '\\';
        default:
            if(chr && c == '\'')
                return '\'';
            else if(!chr && c == '"')
                return '"';
            else
                return 0;
    }
}